

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Client::write_request(Client *this,Stream *strm,Request *req,bool last_connection)

{
  size_t __args;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  anon_class_16_2_4c09b290 local_1a0;
  function<void_(const_char_*,_unsigned_long)> local_190;
  ulong local_170;
  size_t end_offset;
  size_t offset;
  string *data;
  undefined1 local_150 [8];
  string length_1;
  undefined1 local_118 [8];
  string length;
  undefined1 local_c0 [8];
  Headers headers;
  char *local_88 [3];
  undefined1 local_70 [8];
  string path;
  BufferStream bstrm;
  bool last_connection_local;
  Request *req_local;
  Stream *strm_local;
  Client *this_local;
  
  BufferStream::BufferStream((BufferStream *)((long)&path.field_2 + 8));
  detail::encode_url((string *)local_70,&req->path);
  local_88[0] = (char *)std::__cxx11::string::c_str();
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count = std::__cxx11::string::c_str();
  Stream::write_format<char_const*,char_const*>
            ((Stream *)((long)&path.field_2 + 8),"%s %s HTTP/1.1\r\n",local_88,
             (char **)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_c0);
  if (last_connection) {
    std::
    multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const(&)[11],char_const(&)[6]>
              ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)local_c0,(char (*) [11])"Connection",(char (*) [6])0x2c736a);
  }
  bVar1 = Request::has_header(req,"Host");
  if (!bVar1) {
    uVar2 = (*this->_vptr_Client[4])();
    if ((uVar2 & 1) == 0) {
      if (this->port_ == 0x50) {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_c0,(char (*) [5])"Host",&this->host_);
      }
      else {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_c0,(char (*) [5])"Host",&this->host_and_port_);
      }
    }
    else if (this->port_ == 0x1bb) {
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_c0,(char (*) [5])"Host",&this->host_);
    }
    else {
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_c0,(char (*) [5])"Host",&this->host_and_port_);
    }
  }
  bVar1 = Request::has_header(req,"Accept");
  if (!bVar1) {
    std::
    multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const(&)[7],char_const(&)[4]>
              ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)local_c0,(char (*) [7])"Accept",(char (*) [4])"*/*");
  }
  bVar1 = Request::has_header(req,"User-Agent");
  if (!bVar1) {
    length.field_2._8_8_ =
         std::
         multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::emplace<char_const(&)[11],char_const(&)[16]>
                   ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     *)local_c0,(char (*) [11])"User-Agent",(char (*) [16])"cpp-httplib/0.2");
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = Request::has_header(req,"Content-Type");
    if (!bVar1) {
      length_1.field_2._8_8_ =
           std::
           multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<char_const(&)[13],char_const(&)[11]>
                     ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_c0,(char (*) [13])"Content-Type",(char (*) [11])"text/plain");
    }
    bVar1 = Request::has_header(req,"Content-Length");
    if (!bVar1) {
      uVar4 = std::__cxx11::string::size();
      std::__cxx11::to_string((string *)local_150,uVar4);
      data = (string *)
             std::
             multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::emplace<char_const(&)[15],std::__cxx11::string&>
                       ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)local_c0,(char (*) [15])"Content-Length",
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_150);
      std::__cxx11::string::~string((string *)local_150);
    }
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&req->content_provider);
    if (bVar1) {
      std::__cxx11::to_string((string *)local_118,req->content_length);
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[15],std::__cxx11::string&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_c0,(char (*) [15])"Content-Length",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      std::__cxx11::string::~string((string *)local_118);
    }
    else {
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[15],char_const(&)[2]>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_c0,(char (*) [15])"Content-Length",(char (*) [2])0x2ca0c1);
    }
  }
  detail::write_headers<httplib::Request>
            ((Stream *)((long)&path.field_2 + 8),req,(Headers *)local_c0);
  offset = (size_t)BufferStream::get_buffer_abi_cxx11_((BufferStream *)((long)&path.field_2 + 8));
  uVar5 = std::__cxx11::string::data();
  uVar6 = std::__cxx11::string::size();
  (*strm->_vptr_Stream[3])(strm,uVar5,uVar6);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    (*strm->_vptr_Stream[5])(strm,&req->body);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&req->content_provider);
    if (bVar1) {
      end_offset = 0;
      local_170 = req->content_length;
      while (__args = end_offset, end_offset < local_170) {
        uVar4 = local_170 - end_offset;
        local_1a0.offset = &end_offset;
        local_1a0.strm = strm;
        std::function<void(char_const*,unsigned_long)>::
        function<httplib::Client::write_request(httplib::Stream&,httplib::Request_const&,bool)::_lambda(char_const*,unsigned_long)_1_,void>
                  ((function<void(char_const*,unsigned_long)> *)&local_190,&local_1a0);
        std::
        function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>)>
        ::operator()(&req->content_provider,__args,uVar4,&local_190);
        std::function<void_(const_char_*,_unsigned_long)>::~function(&local_190);
      }
    }
  }
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_c0);
  std::__cxx11::string::~string((string *)local_70);
  BufferStream::~BufferStream((BufferStream *)((long)&path.field_2 + 8));
  return;
}

Assistant:

inline void Client::write_request(Stream &strm, const Request &req,
                                  bool last_connection) {
  BufferStream bstrm;

  // Request line
  auto path = detail::encode_url(req.path);

  bstrm.write_format("%s %s HTTP/1.1\r\n", req.method.c_str(), path.c_str());

  // Additonal headers
  Headers headers;
  if (last_connection) { headers.emplace("Connection", "close"); }

  if (!req.has_header("Host")) {
    if (is_ssl()) {
      if (port_ == 443) {
        headers.emplace("Host", host_);
      } else {
        headers.emplace("Host", host_and_port_);
      }
    } else {
      if (port_ == 80) {
        headers.emplace("Host", host_);
      } else {
        headers.emplace("Host", host_and_port_);
      }
    }
  }

  if (!req.has_header("Accept")) { headers.emplace("Accept", "*/*"); }

  if (!req.has_header("User-Agent")) {
    headers.emplace("User-Agent", "cpp-httplib/0.2");
  }

  if (req.body.empty()) {
    if (req.content_provider) {
      auto length = std::to_string(req.content_length);
      headers.emplace("Content-Length", length);
    } else {
      headers.emplace("Content-Length", "0");
    }
  } else {
    if (!req.has_header("Content-Type")) {
      headers.emplace("Content-Type", "text/plain");
    }

    if (!req.has_header("Content-Length")) {
      auto length = std::to_string(req.body.size());
      headers.emplace("Content-Length", length);
    }
  }

  detail::write_headers(bstrm, req, headers);

  // Flush buffer
  auto &data = bstrm.get_buffer();
  strm.write(data.data(), data.size());

  // Body
  if (req.body.empty()) {
    if (req.content_provider) {
      size_t offset = 0;
      size_t end_offset = req.content_length;
      while (offset < end_offset) {
        req.content_provider(offset, end_offset - offset,
                             [&](const char *d, size_t l) {
                               auto written_length = strm.write(d, l);
                               offset += written_length;
                             });
      }
    }
  } else {
    strm.write(req.body);
  }
}